

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_set_outgoing_locales(OPEN_HANDLE open,AMQP_VALUE outgoing_locales_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE outgoing_locales_amqp_value;
  OPEN_INSTANCE *open_instance;
  int result;
  AMQP_VALUE outgoing_locales_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x66f;
  }
  else {
    if (outgoing_locales_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(outgoing_locales_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      open_instance._4_4_ = 0x67f;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,5,local_30);
      if (iVar1 == 0) {
        open_instance._4_4_ = 0;
      }
      else {
        open_instance._4_4_ = 0x685;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_set_outgoing_locales(OPEN_HANDLE open, AMQP_VALUE outgoing_locales_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE outgoing_locales_amqp_value;
        if (outgoing_locales_value == NULL)
        {
            outgoing_locales_amqp_value = NULL;
        }
        else
        {
            outgoing_locales_amqp_value = amqpvalue_clone(outgoing_locales_value);
        }
        if (outgoing_locales_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 5, outgoing_locales_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(outgoing_locales_amqp_value);
        }
    }

    return result;
}